

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O0

void __thiscall
FastPForLib::VariableByte::_encodeArray<unsigned_long>
          (VariableByte *this,unsigned_long *in,size_t length,uint32_t *out,size_t *nvalue)

{
  ulong uVar1;
  bool bVar2;
  size_t in_RCX;
  unsigned_long *in_RDX;
  VariableByte *in_RSI;
  ulong *in_R8;
  size_t storageinbytes;
  size_t bytenvalue;
  uint8_t *initbout;
  uint8_t *bout;
  size_t sVar3;
  uchar *inbyte;
  
  uVar1 = *in_R8;
  sVar3 = in_RCX;
  encodeToByteArray<unsigned_long>(in_RSI,in_RDX,in_RCX,(uint8_t *)in_R8,(size_t *)in_RCX);
  inbyte = (uchar *)(uVar1 * 4 + sVar3);
  while( true ) {
    bVar2 = needPaddingTo32Bits<unsigned_char>(inbyte);
    if (!bVar2) break;
    *inbyte = '\0';
    inbyte = inbyte + 1;
  }
  *in_R8 = (long)inbyte - in_RCX >> 2;
  return;
}

Assistant:

void _encodeArray(const T *in, const size_t length, uint32_t *out,
                    size_t &nvalue) {
    uint8_t *bout = reinterpret_cast<uint8_t *>(out);
    const uint8_t *const initbout = reinterpret_cast<uint8_t *>(out);
    size_t bytenvalue = nvalue * sizeof(uint32_t);
    encodeToByteArray(in, length, bout, bytenvalue);
    bout += bytenvalue;
    while (needPaddingTo32Bits(bout)) {
      *bout++ = 0;
    }
    const size_t storageinbytes = bout - initbout;
    assert((storageinbytes % 4) == 0);
    nvalue = storageinbytes / 4;
  }